

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O2

void Abc_CexPrint(Abc_Cex_t *p)

{
  int iVar1;
  char *__s;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  if (p == (Abc_Cex_t *)0x0) {
    __s = "The counter example is NULL.";
  }
  else {
    if (p != (Abc_Cex_t *)0x1) {
      Abc_CexPrintStats(p);
      printf("State    : ");
      uVar3 = 0;
      while (uVar2 = (uint)uVar3, (int)uVar2 < p->nRegs) {
        printf("%d",(ulong)(((uint)(&p[1].iPo)[uVar3 >> 5] >> (uVar2 & 0x1f) & 1) != 0));
        uVar3 = (ulong)(uVar2 + 1);
      }
      putchar(10);
      for (uVar2 = 0; (int)uVar2 <= p->iFrame; uVar2 = uVar2 + 1) {
        printf("Frame %3d : ",(ulong)uVar2);
        for (iVar1 = 0; uVar4 = (int)uVar3 + iVar1, iVar1 < p->nPis; iVar1 = iVar1 + 1) {
          printf("%d",(ulong)(((uint)(&p[1].iPo)[(int)uVar4 >> 5] >> (uVar4 & 0x1f) & 1) != 0));
        }
        putchar(10);
        uVar3 = (ulong)uVar4;
      }
      if ((int)uVar3 == p->nBits) {
        return;
      }
      __assert_fail("k == p->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                    ,0x150,"void Abc_CexPrint(Abc_Cex_t *)");
    }
    __s = "The counter example is present but not available (pointer has value \"1\").";
  }
  puts(__s);
  return;
}

Assistant:

void Abc_CexPrint( Abc_Cex_t * p )
{
    int i, f, k;
    if ( p == NULL )
    {
        printf( "The counter example is NULL.\n" );
        return;
    }
    if ( p == (Abc_Cex_t *)(ABC_PTRINT_T)1 )
    {
        printf( "The counter example is present but not available (pointer has value \"1\").\n" );
        return;
    }
    Abc_CexPrintStats( p );
    printf( "State    : " );
    for ( k = 0; k < p->nRegs; k++ )
        printf( "%d", Abc_InfoHasBit(p->pData, k) );
    printf( "\n" );
    for ( f = 0; f <= p->iFrame; f++ )
    {
        printf( "Frame %3d : ", f );
        for ( i = 0; i < p->nPis; i++ )
            printf( "%d", Abc_InfoHasBit(p->pData, k++) );
        printf( "\n" );
    }
    assert( k == p->nBits );
}